

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metadata_lite.h
# Opt level: O3

void __thiscall google::protobuf::FileOptions::FileOptions(FileOptions *this,Arena *arena)

{
  (this->super_Message).super_MessageLite._internal_metadata_.ptr_ = (intptr_t)arena;
  (this->super_Message).super_MessageLite._vptr_MessageLite =
       (_func_int **)&PTR__FileOptions_004540c0;
  (this->field_0)._impl_._extensions_.arena_ = arena;
  *(undefined4 *)((long)&this->field_0 + 8) = 0;
  (this->field_0)._impl_._extensions_.map_.flat = (KeyValue *)0x0;
  *(undefined8 *)((long)&this->field_0 + 0x18) = 0;
  (this->field_0)._impl_.uninterpreted_option_.super_RepeatedPtrFieldBase.tagged_rep_or_elem_ =
       (void *)0x0;
  *(int *)((long)&this->field_0 + 0x28) = 0;
  *(int *)((long)&this->field_0 + 0x2c) = 0;
  (this->field_0)._impl_.uninterpreted_option_.super_RepeatedPtrFieldBase.arena_ = arena;
  (this->field_0)._impl_.java_package_.tagged_ptr_.ptr_ = &internal::fixed_address_empty_string;
  (this->field_0)._impl_.java_outer_classname_.tagged_ptr_.ptr_ =
       &internal::fixed_address_empty_string;
  (this->field_0)._impl_.go_package_.tagged_ptr_.ptr_ = &internal::fixed_address_empty_string;
  (this->field_0)._impl_.objc_class_prefix_.tagged_ptr_.ptr_ = &internal::fixed_address_empty_string
  ;
  (this->field_0)._impl_.csharp_namespace_.tagged_ptr_.ptr_ = &internal::fixed_address_empty_string;
  (this->field_0)._impl_.swift_prefix_.tagged_ptr_.ptr_ = &internal::fixed_address_empty_string;
  (this->field_0)._impl_.php_class_prefix_.tagged_ptr_.ptr_ = &internal::fixed_address_empty_string;
  (this->field_0)._impl_.php_namespace_.tagged_ptr_.ptr_ = &internal::fixed_address_empty_string;
  (this->field_0)._impl_.php_metadata_namespace_.tagged_ptr_.ptr_ =
       &internal::fixed_address_empty_string;
  (this->field_0)._impl_.ruby_package_.tagged_ptr_.ptr_ = &internal::fixed_address_empty_string;
  (this->field_0)._impl_.optimize_for_ = 1;
  (this->field_0)._impl_.cc_enable_arenas_ = true;
  *(undefined8 *)((long)&(this->field_0)._impl_.features_ + 7) = 0;
  (this->field_0)._impl_.features_ = (FeatureSet *)0x0;
  return;
}

Assistant:

explicit InternalMetadata(Arena* arena) {
    ptr_ = reinterpret_cast<intptr_t>(arena);
  }